

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<int,long,int(*)(char_const**,int*)>
               (long num1,_func_int_char_ptr_ptr_int_ptr *read_f,bool is_ok)

{
  byte *pbVar1;
  byte bVar2;
  mp_type mVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  char *pcVar13;
  code *pcVar14;
  char (*pacVar15) [16];
  char (*pacVar16) [16];
  double dVar17;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  char *pcVar18;
  ulong uVar19;
  char *pcVar20;
  uint uVar21;
  byte *pbVar22;
  ulong uVar23;
  undefined8 *puVar24;
  byte *pbVar25;
  ulong uVar26;
  ulong uVar27;
  undefined4 uVar28;
  byte *pbVar29;
  char *pcVar30;
  char *pcVar31;
  undefined1 *puVar32;
  uint *val;
  char *pcVar33;
  undefined8 *puVar34;
  byte *pbVar35;
  byte *pbVar36;
  undefined1 *puVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_12e0;
  undefined1 *puStack_12d8;
  char acStack_12d0 [256];
  undefined1 uStack_11d0;
  undefined8 uStack_11cf;
  undefined1 auStack_11c7 [247];
  undefined8 *puStack_10d0;
  byte *pbStack_10c8;
  code *pcStack_10c0;
  double dStack_10b0;
  undefined8 *puStack_10a8;
  char (*pacStack_10a0) [16];
  char acStack_1098 [256];
  byte bStack_f98;
  undefined1 auStack_f97 [2];
  undefined1 auStack_f95 [6];
  undefined8 uStack_f8f;
  undefined8 uStack_f87;
  long lStack_e90;
  ulong uStack_e88;
  char *pcStack_e80;
  char *pcStack_e78;
  char *pcStack_e70;
  code *pcStack_e68;
  char (*pacStack_e60) [16];
  char *pcStack_e58;
  float fStack_e50;
  undefined4 uStack_e4c;
  double dStack_e48;
  double dStack_e40;
  char (*pacStack_e38) [16];
  char acStack_e30 [256];
  byte bStack_d30;
  undefined8 uStack_d2f;
  char acStack_d27 [255];
  long lStack_c28;
  ulong uStack_c20;
  char *pcStack_c18;
  char *pcStack_c10;
  char *pcStack_c08;
  code *pcStack_c00;
  char (*pacStack_bf8) [16];
  char *pcStack_bf0;
  float fStack_be8;
  undefined4 uStack_be4;
  double dStack_be0;
  double dStack_bd8;
  code *pcStack_bd0;
  byte bStack_bc8;
  undefined8 uStack_bc7;
  char acStack_bbf [247];
  char acStack_ac8 [256];
  undefined1 auStack_9c8 [8];
  undefined8 *puStack_9c0;
  ulong uStack_9b8;
  undefined8 *puStack_9b0;
  long lStack_9a8;
  undefined1 *puStack_9a0;
  code *pcStack_998;
  code *pcStack_990;
  float fStack_984;
  double dStack_980;
  double dStack_978;
  undefined8 *puStack_970;
  char (*pacStack_968) [16];
  byte bStack_960;
  undefined1 auStack_95f [2];
  undefined1 auStack_95d [6];
  undefined8 auStack_957 [30];
  char acStack_860 [256];
  undefined1 auStack_760 [8];
  char (*pacStack_758) [16];
  char *pcStack_750;
  char *pcStack_748;
  char *pcStack_740;
  char *pcStack_738;
  code *pcStack_730;
  float fStack_720;
  undefined4 uStack_71c;
  char *pcStack_718;
  char *pcStack_710;
  double dStack_708;
  double dStack_700;
  char acStack_6f8 [9];
  char acStack_6ef [247];
  char acStack_5f8 [256];
  undefined1 auStack_4f8 [8];
  ulong uStack_4f0;
  ulong uStack_4e8;
  char *pcStack_4e0;
  char *pcStack_4d8;
  undefined1 *puStack_4d0;
  code *pcStack_4c8;
  uint uStack_4b4;
  ulong uStack_4b0;
  float fStack_4a4;
  double dStack_4a0;
  undefined1 *puStack_498;
  byte bStack_490;
  undefined8 uStack_48f;
  undefined1 auStack_487 [247];
  char acStack_390 [256];
  undefined1 auStack_290 [8];
  byte *pbStack_288;
  char *pcStack_280;
  byte *pbStack_278;
  char *pcStack_270;
  byte *pbStack_268;
  code *pcStack_260;
  float local_258;
  undefined4 local_254;
  byte *local_250;
  char *local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  byte local_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  local_254 = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcVar18 = "%lld";
  if (-1 < num1) {
    pcVar18 = "%llu";
  }
  iVar6 = 0;
  pcStack_260 = (code *)0x12fef9;
  iVar5 = snprintf(local_138 + 0xe,0xf2,pcVar18,num1);
  pcVar18 = local_138 + (long)iVar5 + 0xe;
  pcStack_260 = (code *)0x12ff1d;
  iVar5 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
  pcStack_260 = (code *)0x12ff3c;
  snprintf(pcVar18 + iVar5,(size_t)(local_38 + -(long)(pcVar18 + iVar5)),"int%zu_t",0x20);
  pcStack_260 = (code *)0x12ff4b;
  _space((FILE *)_stdout);
  pcStack_260 = (code *)0x12ff64;
  fwrite("# ",2,1,_stdout);
  pcStack_260 = (code *)0x12ff74;
  fputs(local_138,_stdout);
  pcStack_260 = (code *)0x12ff81;
  fputc(10,_stdout);
  if (-1 < num1) {
    pcStack_260 = (code *)0x12ff93;
    iVar6 = test_encode_uint_all_sizes((char (*) [16])&local_238,num1);
  }
  pacVar16 = (char (*) [16])(&local_238 + (long)iVar6 * 0x10);
  pcStack_260 = (code *)0x12ffaf;
  iVar5 = test_encode_int_all_sizes(pacVar16,num1);
  uVar21 = iVar6 + iVar5;
  if (uVar21 != 0 && SCARRY4(iVar6,iVar5) == (int)uVar21 < 0) {
    local_258 = (float)num1;
    local_240 = (double)num1;
    pbVar35 = (byte *)(ulong)uVar21;
    pbVar25 = (byte *)((long)&local_237 + 1);
    pbVar22 = (byte *)0x0;
    local_248 = (char *)num1;
    do {
      uVar21 = (uint)pacVar16;
      lVar8 = (long)pbVar22 * 0x10;
      pbVar36 = &local_238 + lVar8;
      bVar2 = pbVar25[-2];
      pcVar13 = (char *)(ulong)bVar2;
      mVar3 = mp_type_hint[(long)pcVar13];
      pbVar29 = pbVar25;
      if (mVar3 == MP_UINT) {
        switch(bVar2) {
        case 0xcc:
          pcVar13 = (char *)(ulong)pbVar25[-1];
          break;
        case 0xcd:
          pcVar13 = (char *)(ulong)(ushort)(*(ushort *)(pbVar25 + -1) << 8 |
                                           *(ushort *)(pbVar25 + -1) >> 8);
          pbVar29 = local_22f + lVar8 + -6;
          break;
        case 0xce:
          uVar4 = *(uint *)(pbVar25 + -1);
          pcVar13 = (char *)(ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8
                                   | uVar4 << 0x18);
          pbVar29 = local_22f + lVar8 + -4;
          break;
        case 0xcf:
          uVar27 = *(ulong *)(pbVar25 + -1);
          pcVar13 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                             (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                             (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                             (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
          pbVar29 = local_22f + lVar8;
          break;
        default:
          if (-1 < (char)bVar2) {
            pbVar29 = local_22f + lVar8 + -8;
            break;
          }
LAB_00130380:
          pcStack_260 = (code *)0x130385;
          test_read_num<int,long,int(*)(char_const**,int*)>();
          goto LAB_00130385;
        }
        if (pcVar13 == (char *)num1) goto LAB_00130159;
LAB_001303d7:
        pcStack_260 = (code *)0x1303dc;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        pbVar29 = pbVar35;
        pcVar13 = (char *)num1;
        goto LAB_001303dc;
      }
      if (mVar3 != MP_FLOAT) {
        if (mVar3 != MP_INT) {
          if (bVar2 != 0xcb) goto LAB_0013038a;
          uVar27 = *(ulong *)(pbVar25 + -1);
          dVar17 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                            (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                            (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                            (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
          if ((dVar17 != local_240) || (NAN(dVar17) || NAN(local_240))) {
            pcStack_260 = (code *)0x1303ae;
            test_read_num<int,long,int(*)(char_const**,int*)>();
            goto LAB_001303ae;
          }
          pbVar29 = local_22f + lVar8;
          goto LAB_00130159;
        }
        pcVar13 = (char *)(long)(char)bVar2;
        switch(bVar2) {
        case 0xd0:
          pcVar13 = (char *)(long)(char)pbVar25[-1];
          break;
        case 0xd1:
          pcVar13 = (char *)(long)(short)(*(ushort *)(pbVar25 + -1) << 8 |
                                         *(ushort *)(pbVar25 + -1) >> 8);
          pbVar29 = local_22f + lVar8 + -6;
          break;
        case 0xd2:
          uVar4 = *(uint *)(pbVar25 + -1);
          pcVar13 = (char *)(long)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                        (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
          pbVar29 = local_22f + lVar8 + -4;
          break;
        case 0xd3:
          uVar27 = *(ulong *)(pbVar25 + -1);
          pcVar13 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                             (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                             (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                             (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
          pbVar29 = local_22f + lVar8;
          break;
        default:
          if (bVar2 < 0xe0) {
            pcStack_260 = (code *)0x130380;
            test_read_num<int,long,int(*)(char_const**,int*)>();
            goto LAB_00130380;
          }
          pbVar29 = local_22f + lVar8 + -8;
        }
        if (pcVar13 == (char *)num1) goto LAB_00130159;
LAB_001303d2:
        pcStack_260 = (code *)0x1303d7;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_001303d7;
      }
      if (bVar2 != 0xca) {
LAB_001303ae:
        pcStack_260 = (code *)0x1303cd;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar4 = *(uint *)(pbVar25 + -1);
      fVar12 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                      uVar4 << 0x18);
      if ((fVar12 != local_258) || (NAN(fVar12) || NAN(local_258))) {
        pcStack_260 = (code *)0x1303d2;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_001303d2;
      }
      pbVar29 = pbVar25 + 3;
LAB_00130159:
      pbVar1 = pbVar25 + -2;
      switch(bVar2) {
      case 0xcc:
        pcVar18 = (char *)(ulong)pbVar25[-1];
        goto LAB_0013018c;
      case 0xcd:
        pbVar36 = local_22f + lVar8 + -6;
        pcVar18 = (char *)(ulong)(ushort)(*(ushort *)(pbVar25 + -1) << 8 |
                                         *(ushort *)(pbVar25 + -1) >> 8);
        break;
      case 0xce:
        uVar21 = *(uint *)(pbVar25 + -1);
        pcVar18 = (char *)(ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8
                                 | uVar21 << 0x18);
        pbVar36 = pbVar25 + 3;
        goto LAB_001301aa;
      case 0xcf:
        uVar27 = *(ulong *)(pbVar25 + -1);
        pcVar18 = (char *)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                           (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                           (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                           (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
        pbVar36 = local_22f + lVar8;
LAB_001301aa:
        if (pcVar18 < (char *)0x80000000) break;
LAB_00130357:
        iVar6 = 1;
        pcVar18 = (char *)0x0;
        iVar5 = 0;
        pbVar36 = pbVar1;
        goto LAB_00130207;
      case 0xd0:
        pcVar18 = (char *)(ulong)(uint)(int)(char)pbVar25[-1];
LAB_0013018c:
        pbVar36 = local_22f + lVar8 + -7;
        break;
      case 0xd1:
        pbVar36 = local_22f + lVar8 + -6;
        pcVar18 = (char *)(ulong)(uint)(int)(short)(*(ushort *)(pbVar25 + -1) << 8 |
                                                   *(ushort *)(pbVar25 + -1) >> 8);
        break;
      case 0xd2:
        uVar21 = *(uint *)(pbVar25 + -1);
        pcVar18 = (char *)(ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8
                                 | uVar21 << 0x18);
        pbVar36 = local_22f + lVar8 + -4;
        break;
      case 0xd3:
        uVar27 = *(ulong *)(pbVar25 + -1);
        uVar26 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                 (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8;
        pcVar18 = (char *)(uVar26 | (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                           (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
        if ((char *)(long)(int)uVar26 == pcVar18) {
          pbVar36 = local_22f + lVar8;
          break;
        }
        goto LAB_00130357;
      default:
        if ((char)bVar2 < -0x20) goto LAB_00130357;
        iVar5 = 1;
        iVar6 = 0;
        pcVar18 = (char *)(ulong)(uint)(int)(char)bVar2;
        pbVar36 = local_22f + lVar8 + -8;
        goto LAB_00130207;
      }
      iVar5 = 1;
      iVar6 = 0;
LAB_00130207:
      if ((char)local_254 == '\0') {
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_260 = (code *)0x1302c4;
        _ok(iVar6,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X");
        pacVar16 = (char (*) [16])(ulong)(pbVar1 == pbVar36);
        pcStack_260 = (code *)0x1302ea;
        _ok((uint)(pbVar1 == pbVar36),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
        num1 = (long)local_248;
      }
      else {
        pcStack_260 = (code *)0x130243;
        local_250 = pbVar22;
        _ok(iVar5,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X");
        uVar21 = (uint)(pbVar29 == pbVar36);
        pcStack_260 = (code *)0x130269;
        _ok((uint)(pbVar29 == pbVar36),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        num1 = (long)local_248;
        iVar5 = (int)pcVar18;
        if ((long)local_248 < 0) {
          pbVar22 = pbVar35;
          pcVar13 = local_248;
          if (-1 < iVar5) {
LAB_001303dc:
            pcStack_260 = test_read_num<long,int,int(*)(char_const**,long*)>;
            test_read_num<int,long,int(*)(char_const**,int*)>();
            builtin_strncpy(acStack_390,"typed read of ",0xf);
            uStack_4b0 = (ulong)(int)uVar21;
            if ((int)uVar21 < 0) {
              pcVar30 = "%lld";
              uVar27 = uStack_4b0;
            }
            else {
              pcVar30 = "%llu";
              uVar27 = (ulong)uVar21;
            }
            pcStack_4c8 = (code *)0x130463;
            uStack_4b4 = uVar21;
            pbStack_288 = pbVar22;
            pcStack_280 = pcVar18;
            pbStack_278 = pbVar29;
            pcStack_270 = pcVar13;
            pbStack_268 = pbVar36;
            pcStack_260 = (code *)pbVar25;
            iVar5 = snprintf(acStack_390 + 0xe,0xf2,pcVar30,uVar27);
            pcVar18 = acStack_390 + 0xe + iVar5;
            iVar6 = 0;
            pcStack_4c8 = (code *)0x130481;
            iVar5 = snprintf(pcVar18,(size_t)(auStack_290 + -(long)pcVar18)," into ");
            pcStack_4c8 = (code *)0x1304a0;
            snprintf(pcVar18 + iVar5,(size_t)(auStack_290 + -(long)(pcVar18 + iVar5)),"int%zu_t",
                     0x40);
            pcStack_4c8 = (code *)0x1304af;
            _space((FILE *)_stdout);
            pcStack_4c8 = (code *)0x1304c8;
            fwrite("# ",2,1,_stdout);
            pcStack_4c8 = (code *)0x1304d8;
            fputs(acStack_390,_stdout);
            pcStack_4c8 = (code *)0x1304e5;
            fputc(10,_stdout);
            if (-1 < (int)uStack_4b4) {
              pcStack_4c8 = (code *)0x1304f9;
              iVar6 = test_encode_uint_all_sizes((char (*) [16])&bStack_490,(ulong)uVar21);
            }
            uVar27 = uStack_4b0;
            pcVar18 = (char *)(&bStack_490 + (long)iVar6 * 0x10);
            pcStack_4c8 = (code *)0x13051a;
            iVar5 = test_encode_int_all_sizes((char (*) [16])pcVar18,uStack_4b0);
            uVar21 = iVar6 + iVar5;
            if (uVar21 == 0 || SCARRY4(iVar6,iVar5) != (int)uVar21 < 0) {
              return;
            }
            fStack_4a4 = (float)(int)uStack_4b4;
            dStack_4a0 = (double)(int)uStack_4b4;
            uVar26 = (ulong)uVar21;
            puVar37 = (undefined1 *)((long)&uStack_48f + 1);
            pcVar30 = (char *)0x0;
            goto LAB_00130547;
          }
          pcVar13 = (char *)(long)iVar5;
          pcVar30 = "(int64_t)num1 == (int64_t)num2";
          iVar5 = 0x746;
        }
        else {
          if (iVar5 < 0) {
LAB_00130385:
            pcStack_260 = (code *)0x13038a;
            test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_0013038a:
            pcStack_260 = (code *)0x1303a9;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          pcVar13 = (char *)((ulong)pcVar18 & 0xffffffff);
          pcVar30 = "(uint64_t)num1 == (uint64_t)num2";
          iVar5 = 0x743;
        }
        pacVar16 = (char (*) [16])(ulong)(pcVar13 == local_248);
        pcStack_260 = (code *)0x13032a;
        _ok((uint)(pcVar13 == local_248),pcVar30,
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            iVar5,"check int number");
        pbVar22 = local_250;
      }
      pbVar22 = pbVar22 + 1;
      pbVar25 = pbVar25 + 0x10;
      pbVar35 = pbVar35 + -1;
    } while (pbVar35 != (byte *)0x0);
  }
  return;
LAB_00130547:
  lVar8 = (long)pcVar30 * 0x10;
  bVar2 = puVar37[-2];
  uVar19 = (ulong)bVar2;
  uVar23 = (ulong)(char)bVar2;
  mVar3 = mp_type_hint[uVar19];
  puVar32 = puVar37;
  if (mVar3 != MP_UINT) {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_00130873;
      uVar21 = *(uint *)(puVar37 + -1);
      fVar12 = (float)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                      uVar21 << 0x18);
      if ((fVar12 != fStack_4a4) || (NAN(fVar12) || NAN(fStack_4a4))) {
        pcStack_4c8 = (code *)0x130897;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_00130897;
      }
      puVar32 = puVar37 + 3;
      goto LAB_001306c7;
    }
    if (mVar3 == MP_INT) {
      val = &switchD_0013059d::switchdataD_00139b0c;
      switch(bVar2) {
      case 0xd0:
        uVar19 = (ulong)(char)puVar37[-1];
        break;
      case 0xd1:
        uVar19 = (ulong)(short)(*(ushort *)(puVar37 + -1) << 8 | *(ushort *)(puVar37 + -1) >> 8);
        puVar32 = auStack_487 + lVar8 + -6;
        break;
      case 0xd2:
        uVar21 = *(uint *)(puVar37 + -1);
        uVar19 = (ulong)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                             uVar21 << 0x18);
        puVar32 = auStack_487 + lVar8 + -4;
        break;
      case 0xd3:
        uVar19 = *(ulong *)(puVar37 + -1);
        uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                 (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                 (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                 (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
        puVar32 = auStack_487 + lVar8;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_4c8 = (code *)0x13085f;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013085f;
        }
        uVar19 = uVar23;
        puVar32 = auStack_487 + lVar8 + -8;
        val = (uint *)pcVar18;
      }
      if (uVar19 == uVar27) goto LAB_001306c7;
      pcStack_4c8 = (code *)0x1308bb;
      test_read_num<long,int,int(*)(char_const**,long*)>();
      goto LAB_001308bb;
    }
    if (bVar2 != 0xcb) {
LAB_00130897:
      pcStack_4c8 = (code *)0x1308b6;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar27 = *(ulong *)(puVar37 + -1);
    dVar17 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                      (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                      (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                      (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    if ((dVar17 == dStack_4a0) && (!NAN(dVar17) && !NAN(dStack_4a0))) {
      puVar32 = auStack_487 + lVar8;
      goto LAB_001306c7;
    }
    goto LAB_0013086e;
  }
  val = &switchD_001305fc::switchdataD_00139afc;
  switch(bVar2) {
  case 0xcc:
    uVar19 = (ulong)(byte)puVar37[-1];
    break;
  case 0xcd:
    uVar19 = (ulong)(ushort)(*(ushort *)(puVar37 + -1) << 8 | *(ushort *)(puVar37 + -1) >> 8);
    puVar32 = auStack_487 + lVar8 + -6;
    break;
  case 0xce:
    uVar21 = *(uint *)(puVar37 + -1);
    uVar19 = (ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                    uVar21 << 0x18);
    puVar32 = auStack_487 + lVar8 + -4;
    break;
  case 0xcf:
    uVar19 = *(ulong *)(puVar37 + -1);
    uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
             (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
             (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28 |
             uVar19 << 0x38;
    puVar32 = auStack_487 + lVar8;
    break;
  default:
    if (-1 < (char)bVar2) {
      puVar32 = auStack_487 + lVar8 + -8;
      val = (uint *)pcVar18;
      break;
    }
LAB_0013085f:
    pcStack_4c8 = (code *)0x130864;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00130864;
  }
  if (uVar19 != uVar27) {
LAB_001308bb:
    uVar28 = SUB84(puVar32,0);
    pcStack_4c8 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_5f8,"typed read of ",0xf);
    pcStack_730 = (code *)0x130920;
    uStack_71c = uVar28;
    uStack_4f0 = uVar23;
    uStack_4e8 = uVar27;
    pcStack_4e0 = pcVar30;
    pcStack_4d8 = pcVar13;
    puStack_4d0 = puVar37;
    pcStack_4c8 = (code *)uVar26;
    iVar5 = snprintf(acStack_5f8 + 0xe,0xf2,"%llu",val);
    pcVar18 = acStack_5f8 + (long)iVar5 + 0xe;
    pcStack_730 = (code *)0x130944;
    iVar5 = snprintf(pcVar18,(size_t)(auStack_4f8 + -(long)pcVar18)," into ");
    pcStack_730 = (code *)0x130963;
    snprintf(pcVar18 + iVar5,(size_t)(auStack_4f8 + -(long)(pcVar18 + iVar5)),"int%zu_t",0x40);
    pcStack_730 = (code *)0x130972;
    _space((FILE *)_stdout);
    pcStack_730 = (code *)0x13098b;
    fwrite("# ",2,1,_stdout);
    pcStack_730 = (code *)0x13099b;
    fputs(acStack_5f8,_stdout);
    pcStack_730 = (code *)0x1309a8;
    fputc(10,_stdout);
    pcStack_730 = (code *)0x1309b5;
    pcVar18 = (char *)val;
    uVar21 = test_encode_uint_all_sizes((char (*) [16])acStack_6f8,(uint64_t)val);
    if (-1 < (long)val) {
      pcVar18 = (char *)0x7fffffffffffffff;
      pcStack_730 = (code *)0x1309e0;
      iVar5 = test_encode_int_all_sizes
                        ((char (*) [16])(acStack_6f8 + (long)(int)uVar21 * 0x10),0x7fffffffffffffff)
      ;
      uVar21 = uVar21 + iVar5;
    }
    if ((int)uVar21 < 1) {
      return;
    }
    fStack_720 = (float)val;
    auVar39._8_4_ = (int)((ulong)val >> 0x20);
    auVar39._0_8_ = val;
    auVar39._12_4_ = 0x45300000;
    dStack_700 = auVar39._8_8_ - 1.9342813113834067e+25;
    dStack_708 = dStack_700 + ((double)CONCAT44(0x43300000,(int)val) - 4503599627370496.0);
    uVar27 = (ulong)uVar21;
    pcVar13 = acStack_6f8 + 2;
    pcVar31 = (char *)0x0;
    pcStack_718 = (char *)val;
    goto LAB_00130a52;
  }
LAB_001306c7:
  puVar9 = puVar37 + -2;
  puStack_498 = puVar32;
  switch(bVar2) {
  case 0xcc:
    uVar23 = (ulong)(byte)puVar37[-1];
    goto LAB_00130702;
  case 0xcd:
    puVar9 = auStack_487 + lVar8 + -6;
    uVar23 = (ulong)(ushort)(*(ushort *)(puVar37 + -1) << 8 | *(ushort *)(puVar37 + -1) >> 8);
    break;
  case 0xce:
    uVar21 = *(uint *)(puVar37 + -1);
    uVar23 = (ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                    uVar21 << 0x18);
    puVar9 = auStack_487 + lVar8 + -4;
    break;
  case 0xcf:
    uVar27 = *(ulong *)(puVar37 + -1);
    uVar23 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
             (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
             (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28 |
             uVar27 << 0x38;
    if (-1 < (long)uVar23) goto LAB_0013072c;
LAB_0013083f:
    uVar23 = 0;
    iVar5 = 0;
    goto LAB_0013077a;
  case 0xd0:
    uVar23 = (ulong)(char)puVar37[-1];
LAB_00130702:
    puVar9 = auStack_487 + lVar8 + -7;
    break;
  case 0xd1:
    puVar9 = auStack_487 + lVar8 + -6;
    uVar23 = (ulong)(short)(*(ushort *)(puVar37 + -1) << 8 | *(ushort *)(puVar37 + -1) >> 8);
    break;
  case 0xd2:
    uVar21 = *(uint *)(puVar37 + -1);
    puVar9 = auStack_487 + lVar8 + -4;
    uVar23 = (ulong)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                         uVar21 << 0x18);
    break;
  case 0xd3:
    uVar27 = *(ulong *)(puVar37 + -1);
    uVar23 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
             (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
             (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28 |
             uVar27 << 0x38;
LAB_0013072c:
    puVar9 = auStack_487 + lVar8;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_0013083f;
    puVar9 = auStack_487 + lVar8 + -8;
  }
  iVar5 = 1;
LAB_0013077a:
  pcVar13 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_4c8 = (code *)0x13079e;
  _ok(iVar5,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
  pcStack_4c8 = (code *)0x1307c6;
  _ok((uint)(puStack_498 == puVar9),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar27 = uStack_4b0;
  if ((int)uStack_4b4 < 0) {
    if (-1 < (long)uVar23) goto LAB_00130869;
    pcVar31 = "(int64_t)num1 == (int64_t)num2";
    iVar5 = 0x746;
  }
  else {
    if ((long)uVar23 < 0) {
LAB_00130864:
      pcStack_4c8 = (code *)0x130869;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130869:
      pcStack_4c8 = (code *)0x13086e;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013086e:
      pcStack_4c8 = (code *)0x130873;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130873:
      pcStack_4c8 = (code *)0x130892;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar31 = "(uint64_t)num1 == (uint64_t)num2";
    iVar5 = 0x743;
  }
  pcVar18 = (char *)(ulong)(uVar23 == uStack_4b0);
  pcStack_4c8 = (code *)0x13082d;
  _ok((uint)(uVar23 == uStack_4b0),pcVar31,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar5,
      "check int number");
  pcVar30 = pcVar30 + 1;
  puVar37 = puVar37 + 0x10;
  uVar26 = uVar26 - 1;
  if (uVar26 == 0) {
    return;
  }
  goto LAB_00130547;
LAB_00130a52:
  lVar8 = (long)pcVar31 * 0x10;
  bVar2 = pcVar13[-2];
  pcVar20 = (char *)(ulong)bVar2;
  pcVar33 = (char *)(long)(char)bVar2;
  mVar3 = mp_type_hint[(long)pcVar20];
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar20 = (char *)(ulong)(byte)pcVar13[-1];
      pcVar18 = pcVar13;
      break;
    case 0xcd:
      pcVar20 = (char *)(ulong)(ushort)(*(ushort *)(pcVar13 + -1) << 8 |
                                       *(ushort *)(pcVar13 + -1) >> 8);
      pcVar18 = acStack_6f8 + lVar8 + 3;
      break;
    case 0xce:
      uVar21 = *(uint *)(pcVar13 + -1);
      pcVar20 = (char *)(ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                               uVar21 << 0x18);
      pcVar18 = acStack_6ef + lVar8 + -4;
      break;
    case 0xcf:
      uVar26 = *(ulong *)(pcVar13 + -1);
      pcVar20 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                         (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                         (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                         (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar18 = acStack_6ef + lVar8;
      break;
    default:
      if (-1 < (char)bVar2) {
        pcVar18 = acStack_6f8 + lVar8 + 1;
        break;
      }
LAB_00130db7:
      pcStack_730 = (code *)0x130dbc;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130dbc;
    }
    if ((uint *)pcVar20 != val) {
LAB_00130e0e:
      pcStack_730 = test_read_num<double,int,int(*)(char_const**,double*)>;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      pcStack_740 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      iVar5 = (int)val;
      builtin_strncpy(acStack_860,"typed read of ",0xf);
      pcStack_990 = (code *)(long)iVar5;
      if (iVar5 < 0) {
        pcVar20 = "%lld";
        pcVar14 = pcStack_990;
      }
      else {
        pcVar20 = "%llu";
        pcVar14 = (code *)((ulong)val & 0xffffffff);
      }
      pcStack_998 = (code *)0x130e95;
      pacStack_968 = (char (*) [16])pcVar18;
      pacStack_758 = (char (*) [16])pcVar31;
      pcStack_750 = pcVar13;
      pcStack_748 = pcVar30;
      pcStack_738 = acStack_6f8 + lVar8;
      pcStack_730 = (code *)uVar27;
      iVar6 = snprintf(acStack_860 + 0xe,0xf2,pcVar20,pcVar14);
      pcVar18 = acStack_860 + 0xe + iVar6;
      iVar7 = 0;
      pcStack_998 = (code *)0x130eb4;
      iVar6 = snprintf(pcVar18,(size_t)(auStack_760 + -(long)pcVar18)," into ");
      puVar37 = auStack_760 + -(long)(pcVar18 + iVar6);
      pcStack_998 = (code *)0x130ece;
      snprintf(pcVar18 + iVar6,(size_t)puVar37,"double");
      pcStack_998 = (code *)0x130edd;
      _space((FILE *)_stdout);
      pcStack_998 = (code *)0x130ef6;
      fwrite("# ",2,1,_stdout);
      pcStack_998 = (code *)0x130f06;
      fputs(acStack_860,_stdout);
      pcStack_998 = (code *)0x130f13;
      fputc(10,_stdout);
      if (-1 < iVar5) {
        pcStack_998 = (code *)0x130f24;
        iVar7 = test_encode_uint_all_sizes
                          ((char (*) [16])&bStack_960,(uint64_t)((ulong)val & 0xffffffff));
      }
      pcVar13 = (char *)(&bStack_960 + (long)iVar7 * 0x10);
      pcStack_998 = (code *)0x130f42;
      pcVar18 = (char *)pcStack_990;
      iVar6 = test_encode_int_all_sizes((char (*) [16])pcVar13,(int64_t)pcStack_990);
      uVar21 = iVar7 + iVar6;
      if (uVar21 == 0 || SCARRY4(iVar7,iVar6) != (int)uVar21 < 0) {
        return;
      }
      fStack_984 = (float)iVar5;
      dStack_980 = (double)iVar5;
      uVar27 = (ulong)uVar21;
      puVar34 = (undefined8 *)(auStack_95f + 1);
      pcVar30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      lVar8 = 0;
      goto LAB_00130f73;
    }
  }
  else {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) {
LAB_00130de5:
        pcStack_730 = (code *)0x130e04;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar21 = *(uint *)(pcVar13 + -1);
      fVar12 = (float)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                      uVar21 << 0x18);
      if ((fVar12 == fStack_720) && (!NAN(fVar12) && !NAN(fStack_720))) {
        pcVar18 = pcVar13 + 3;
        goto LAB_00130bdc;
      }
      pcStack_730 = (code *)0x130e09;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130e09:
      pcStack_730 = (code *)0x130e0e;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130e0e;
    }
    if (mVar3 == MP_INT) {
      switch(bVar2) {
      case 0xd0:
        pcVar20 = (char *)(long)pcVar13[-1];
        pcVar18 = pcVar13;
        break;
      case 0xd1:
        pcVar20 = (char *)(long)(short)(*(ushort *)(pcVar13 + -1) << 8 |
                                       *(ushort *)(pcVar13 + -1) >> 8);
        pcVar18 = acStack_6f8 + lVar8 + 3;
        break;
      case 0xd2:
        uVar21 = *(uint *)(pcVar13 + -1);
        pcVar20 = (char *)(long)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 |
                                      (uVar21 & 0xff00) << 8 | uVar21 << 0x18);
        pcVar18 = acStack_6ef + lVar8 + -4;
        break;
      case 0xd3:
        uVar26 = *(ulong *)(pcVar13 + -1);
        pcVar20 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                           (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                           (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                           (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
        pcVar18 = acStack_6ef + lVar8;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_730 = (code *)0x130db7;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_00130db7;
        }
        pcVar20 = pcVar33;
        pcVar18 = acStack_6f8 + lVar8 + 1;
      }
      if ((uint *)pcVar20 != val) goto LAB_00130e09;
    }
    else {
      if (bVar2 != 0xcb) goto LAB_00130dc1;
      uVar26 = *(ulong *)(pcVar13 + -1);
      dVar17 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                        (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                        (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                        (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      if ((dVar17 != dStack_708) || (NAN(dVar17) || NAN(dStack_708))) {
        pcStack_730 = (code *)0x130de5;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
        goto LAB_00130de5;
      }
      pcVar18 = acStack_6ef + lVar8;
    }
  }
LAB_00130bdc:
  pcVar30 = pcVar13 + -2;
  switch(bVar2) {
  case 0xcc:
    pcVar33 = (char *)(ulong)(byte)pcVar13[-1];
    goto LAB_00130c11;
  case 0xcd:
    pcVar20 = acStack_6f8 + lVar8 + 3;
    pcVar33 = (char *)(ulong)(ushort)(*(ushort *)(pcVar13 + -1) << 8 |
                                     *(ushort *)(pcVar13 + -1) >> 8);
    break;
  case 0xce:
    uVar21 = *(uint *)(pcVar13 + -1);
    pcVar33 = (char *)(ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                             uVar21 << 0x18);
    pcVar20 = acStack_6ef + lVar8 + -4;
    break;
  case 0xcf:
    uVar26 = *(ulong *)(pcVar13 + -1);
    pcVar33 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                       (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                       (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                       (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if (-1 < (long)pcVar33) goto LAB_00130c3f;
LAB_00130d8e:
    pcVar33 = (char *)0x0;
    iVar6 = 1;
    iVar5 = 0;
    pcVar20 = pcVar30;
    goto LAB_00130c91;
  case 0xd0:
    pcVar33 = (char *)(long)pcVar13[-1];
LAB_00130c11:
    pcVar20 = acStack_6f8 + lVar8 + 2;
    break;
  case 0xd1:
    pcVar20 = acStack_6f8 + lVar8 + 3;
    pcVar33 = (char *)(long)(short)(*(ushort *)(pcVar13 + -1) << 8 | *(ushort *)(pcVar13 + -1) >> 8)
    ;
    break;
  case 0xd2:
    uVar21 = *(uint *)(pcVar13 + -1);
    pcVar20 = acStack_6ef + lVar8 + -4;
    pcVar33 = (char *)(long)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8
                                 | uVar21 << 0x18);
    break;
  case 0xd3:
    uVar26 = *(ulong *)(pcVar13 + -1);
    pcVar33 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                       (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                       (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                       (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
LAB_00130c3f:
    pcVar20 = acStack_6ef + lVar8;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_00130d8e;
    pcVar20 = acStack_6f8 + lVar8 + 1;
  }
  iVar5 = 1;
  iVar6 = 0;
LAB_00130c91:
  if ((char)uStack_71c == '\0') {
    pcStack_730 = (code *)0x130d51;
    _ok(iVar6,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcVar18 = "mp_num_pos2 == mp_nums[i]";
    pcStack_730 = (code *)0x130d77;
    _ok((uint)(pcVar30 == pcVar20),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    val = (uint *)pcStack_718;
  }
  else {
    pcStack_730 = (code *)0x130ccd;
    pcStack_710 = pcVar13;
    _ok(iVar5,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcStack_730 = (code *)0x130cf3;
    _ok((uint)(pcVar18 == pcVar20),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    val = (uint *)pcStack_718;
    if ((long)pcVar33 < 0) {
LAB_00130dbc:
      pcStack_730 = (code *)0x130dc1;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130dc1:
      pcStack_730 = (code *)0x130de0;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pcVar18 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_730 = (code *)0x130d27;
    _ok((uint)(pcVar33 == pcStack_718),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar13 = pcStack_710;
    pcVar30 = pcVar31;
  }
  pcVar31 = pcVar31 + 1;
  pcVar13 = pcVar13 + 0x10;
  uVar27 = uVar27 - 1;
  if (uVar27 == 0) {
    return;
  }
  goto LAB_00130a52;
LAB_00130f73:
  lVar10 = lVar8 * 0x10;
  bVar2 = *(byte *)((long)puVar34 + -2);
  pcVar14 = (code *)(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pcVar14];
  puVar24 = puVar34;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar14 = (code *)(ulong)*(byte *)((long)puVar34 + -1);
      break;
    case 0xcd:
      pcVar14 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar34 + -1) << 8 |
                                       *(ushort *)((long)puVar34 + -1) >> 8);
      puVar24 = (undefined8 *)((long)auStack_957 + lVar10 + -6);
      break;
    case 0xce:
      uVar21 = *(uint *)((long)puVar34 + -1);
      pcVar14 = (code *)(ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                               uVar21 << 0x18);
      puVar24 = (undefined8 *)((long)auStack_957 + lVar10 + -4);
      break;
    case 0xcf:
      uVar26 = *(ulong *)((long)puVar34 + -1);
      pcVar14 = (code *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                         (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                         (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                         (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      puVar24 = auStack_957 + lVar8 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_001311cd:
        pcStack_998 = (code *)0x1311d2;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d2:
        pcStack_998 = (code *)0x1311d7;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d7:
        pcStack_998 = (code *)0x1311f6;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar24 = auStack_957 + lVar8 * 2 + -1;
    }
    if (pcVar14 != pcStack_990) {
      pcStack_998 = (code *)0x13121f;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_0013121f:
      pcStack_998 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_998 = (code *)0x139f88;
      builtin_strncpy(acStack_ac8,"typed read of ",0xf);
      pcStack_c00 = (code *)0x13128b;
      uStack_be4 = extraout_EDX;
      pcStack_bd0 = (code *)pcVar18;
      puStack_9c0 = puVar24;
      uStack_9b8 = uVar27;
      puStack_9b0 = puVar34;
      lStack_9a8 = lVar8;
      puStack_9a0 = puVar37;
      iVar5 = snprintf(acStack_ac8 + 0xe,0xf2,"%llu",pcVar13);
      pcVar18 = acStack_ac8 + (long)iVar5 + 0xe;
      pcStack_c00 = (code *)0x1312af;
      iVar5 = snprintf(pcVar18,(size_t)(auStack_9c8 + -(long)pcVar18)," into ");
      pcStack_c00 = (code *)0x1312c9;
      snprintf(pcVar18 + iVar5,(size_t)(auStack_9c8 + -(long)(pcVar18 + iVar5)),"double");
      pcStack_c00 = (code *)0x1312d8;
      _space((FILE *)_stdout);
      pcStack_c00 = (code *)0x1312f1;
      fwrite("# ",2,1,_stdout);
      pcStack_c00 = (code *)0x131301;
      fputs(acStack_ac8,_stdout);
      pcStack_c00 = (code *)0x13130e;
      fputc(10,_stdout);
      pcStack_c00 = (code *)0x13131b;
      iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_bc8,(uint64_t)pcVar13);
      pacVar16 = (char (*) [16])(&bStack_bc8 + (long)iVar5 * 0x10);
      pcStack_c00 = (code *)0x131339;
      pacStack_bf8 = (char (*) [16])pcVar13;
      iVar6 = test_encode_int_all_sizes(pacVar16,(int64_t)pcVar13);
      uVar21 = iVar5 + iVar6;
      if (uVar21 == 0 || SCARRY4(iVar5,iVar6) != (int)uVar21 < 0) {
        return;
      }
      fStack_be8 = (float)(long)pacStack_bf8;
      dStack_be0 = (double)(long)pacStack_bf8;
      uVar27 = (ulong)uVar21;
      pcVar31 = (char *)((long)&uStack_bc7 + 1);
      lVar8 = 0;
      goto LAB_00131368;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_001311fb:
      pcStack_998 = (code *)0x13121a;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar21 = *(uint *)((long)puVar34 + -1);
    fVar12 = (float)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                    uVar21 << 0x18);
    if ((fVar12 != fStack_984) || (NAN(fVar12) || NAN(fStack_984))) goto LAB_001311d2;
    puVar24 = (undefined8 *)((long)puVar34 + 3);
  }
  else if (mVar3 == MP_INT) {
    pcVar14 = (code *)(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pcVar14 = (code *)(long)*(char *)((long)puVar34 + -1);
      pcVar18 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd1:
      pcVar14 = (code *)(long)(short)(*(ushort *)((long)puVar34 + -1) << 8 |
                                     *(ushort *)((long)puVar34 + -1) >> 8);
      puVar24 = (undefined8 *)((long)auStack_957 + lVar10 + -6);
      pcVar18 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd2:
      uVar21 = *(uint *)((long)puVar34 + -1);
      pcVar14 = (code *)(long)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 |
                                    (uVar21 & 0xff00) << 8 | uVar21 << 0x18);
      puVar24 = (undefined8 *)((long)auStack_957 + lVar10 + -4);
      pcVar18 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd3:
      uVar26 = *(ulong *)((long)puVar34 + -1);
      pcVar14 = (code *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                         (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                         (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                         (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      puVar24 = auStack_957 + lVar8 * 2;
      pcVar18 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_998 = (code *)0x1311cd;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001311cd;
      }
      puVar24 = auStack_957 + lVar8 * 2 + -1;
    }
    if (pcVar14 != pcStack_990) goto LAB_0013121f;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_001311d7;
    uVar26 = *(ulong *)((long)puVar34 + -1);
    dVar17 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                      (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                      (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                      (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if ((dVar17 != dStack_980) || (NAN(dVar17) || NAN(dStack_980))) {
      pcStack_998 = (code *)0x1311fb;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_001311fb;
    }
    puVar24 = auStack_957 + lVar8 * 2;
  }
  puStack_970 = (undefined8 *)((long)puVar34 + -2);
  puVar37 = (undefined1 *)(ulong)(uint)(int)(char)bVar2;
  dStack_978 = 0.0;
  pcStack_998 = (code *)0x131113;
  iVar5 = (*(code *)pacStack_968)(&puStack_970,&dStack_978);
  pcStack_998 = (code *)0x13113b;
  _ok((uint)(iVar5 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar37);
  pcStack_998 = (code *)0x131163;
  _ok((uint)(puVar24 == puStack_970),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar38 = ABS(dStack_980 - dStack_978) < 1e-15;
  pcVar13 = (char *)(ulong)bVar38;
  pcVar18 = "double_eq(num1, num2)";
  pcStack_998 = (code *)0x1311a6;
  _ok((uint)bVar38,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar8 = lVar8 + 1;
  puVar34 = puVar34 + 2;
  uVar27 = uVar27 - 1;
  if (uVar27 == 0) {
    return;
  }
  goto LAB_00130f73;
LAB_00131368:
  lVar10 = lVar8 * 0x10;
  bVar2 = pcVar31[-2];
  pacVar15 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar15];
  pcVar20 = pcVar31;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar15 = (char (*) [16])(ulong)(byte)pcVar31[-1];
      break;
    case 0xcd:
      pacVar15 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar31 + -1) << 8 | *(ushort *)(pcVar31 + -1) >> 8);
      pcVar20 = acStack_bbf + lVar10 + -6;
      break;
    case 0xce:
      uVar21 = *(uint *)(pcVar31 + -1);
      pacVar15 = (char (*) [16])
                 (ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                        uVar21 << 0x18);
      pcVar20 = acStack_bbf + lVar10 + -4;
      break;
    case 0xcf:
      uVar26 = *(ulong *)(pcVar31 + -1);
      pacVar15 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar20 = acStack_bbf + lVar8 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131627:
        pcStack_c00 = (code *)0x13162c;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
        pcStack_c00 = (code *)0x131631;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
        pcStack_c00 = (code *)0x131650;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar20 = acStack_bbf + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_bf8) {
      pcStack_c00 = (code *)0x131679;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
      pcStack_c00 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_e30,"typed read of ",0xf);
      pcStack_e68 = (code *)0x1316e2;
      uStack_e4c = extraout_EDX_00;
      pacStack_e38 = (char (*) [16])pcVar13;
      lStack_c28 = lVar8;
      uStack_c20 = uVar27;
      pcStack_c18 = pcVar18;
      pcStack_c10 = pcVar20;
      pcStack_c08 = pcVar31;
      pcStack_c00 = (code *)pcVar30;
      iVar5 = snprintf(acStack_e30 + 0xe,0xf2,"%lld",pacVar16);
      pcVar18 = acStack_e30 + (long)iVar5 + 0xe;
      pcStack_e68 = (code *)0x131703;
      iVar5 = snprintf(pcVar18,(size_t)(&bStack_d30 + -(long)pcVar18)," into ");
      pcStack_e68 = (code *)0x13171d;
      snprintf(pcVar18 + iVar5,(size_t)(&bStack_d30 + -(long)(pcVar18 + iVar5)),"double");
      pcStack_e68 = (code *)0x13172c;
      _space((FILE *)_stdout);
      pcStack_e68 = (code *)0x131745;
      fwrite("# ",2,1,_stdout);
      pcStack_e68 = (code *)0x131752;
      fputs(acStack_e30,_stdout);
      pcStack_e68 = (code *)0x13175f;
      fputc(10,_stdout);
      pacVar15 = (char (*) [16])&bStack_d30;
      pcStack_e68 = (code *)0x131773;
      pacStack_e60 = pacVar16;
      uVar21 = test_encode_int_all_sizes(pacVar15,(int64_t)pacVar16);
      if ((int)uVar21 < 1) {
        return;
      }
      fStack_e50 = (float)(long)pacStack_e60;
      dStack_e48 = (double)(long)pacStack_e60;
      uVar27 = (ulong)uVar21;
      pcVar13 = (char *)((long)&uStack_d2f + 1);
      lVar8 = 0;
      goto LAB_001317a5;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131655:
      pcStack_c00 = (code *)0x131674;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar21 = *(uint *)(pcVar31 + -1);
    fVar12 = (float)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                    uVar21 << 0x18);
    if ((fVar12 != fStack_be8) || (NAN(fVar12) || NAN(fStack_be8))) goto LAB_0013162c;
    pcVar20 = pcVar31 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar15 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar15 = (char (*) [16])(long)pcVar31[-1];
      pcVar13 = (char *)&switchD_001313bd::switchdataD_00139bac;
      break;
    case 0xd1:
      pacVar15 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar31 + -1) << 8 | *(ushort *)(pcVar31 + -1) >> 8);
      pcVar13 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar20 = acStack_bbf + lVar10 + -6;
      break;
    case 0xd2:
      uVar21 = *(uint *)(pcVar31 + -1);
      pacVar15 = (char (*) [16])
                 (long)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                            uVar21 << 0x18);
      pcVar13 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar20 = acStack_bbf + lVar10 + -4;
      break;
    case 0xd3:
      uVar26 = *(ulong *)(pcVar31 + -1);
      pacVar15 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar13 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar20 = acStack_bbf + lVar8 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_c00 = (code *)0x131627;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00131627;
      }
      pcVar20 = acStack_bbf + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_bf8) goto LAB_00131679;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131631;
    uVar26 = *(ulong *)(pcVar31 + -1);
    dVar17 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                      (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                      (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                      (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if ((dVar17 != dStack_be0) || (NAN(dVar17) || NAN(dStack_be0))) {
      pcStack_c00 = (code *)0x131655;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00131655;
    }
    pcVar20 = acStack_bbf + lVar8 * 0x10;
  }
  pcVar30 = pcVar31 + -2;
  pcVar18 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_bd8 = 0.0;
  pcStack_c00 = (code *)0x131508;
  pcStack_bf0 = pcVar30;
  iVar5 = (*pcStack_bd0)(&pcStack_bf0,&dStack_bd8);
  if ((char)uStack_be4 == '\0') {
    pcStack_c00 = (code *)0x1315d8;
    _ok((uint)(iVar5 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar18);
    bVar38 = pcVar30 == pcStack_bf0;
    pcVar13 = "mp_num_pos2 == mp_nums[i]";
    iVar5 = 0x738;
    pcVar20 = "check position";
  }
  else {
    pcVar30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_c00 = (code *)0x131542;
    _ok((uint)(iVar5 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar18);
    pcStack_c00 = (code *)0x13156a;
    _ok((uint)(pcVar20 == pcStack_bf0),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar38 = ABS(dStack_be0 - dStack_bd8) < 1e-15;
    pcVar13 = "double_eq(num1, num2)";
    iVar5 = 0x73e;
    pcVar20 = "check float number";
  }
  pacVar16 = (char (*) [16])(ulong)bVar38;
  pcStack_c00 = (code *)0x131600;
  _ok((uint)bVar38,pcVar13,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar5,
      pcVar20);
  lVar8 = lVar8 + 1;
  pcVar31 = pcVar31 + 0x10;
  uVar27 = uVar27 - 1;
  if (uVar27 == 0) {
    return;
  }
  goto LAB_00131368;
LAB_001317a5:
  lVar10 = lVar8 * 0x10;
  bVar2 = pcVar13[-2];
  pacVar16 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar16];
  pcVar31 = pcVar13;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar16 = (char (*) [16])(ulong)(byte)pcVar13[-1];
      break;
    case 0xcd:
      pacVar16 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar13 + -1) << 8 | *(ushort *)(pcVar13 + -1) >> 8);
      pcVar31 = acStack_d27 + lVar10 + -6;
      break;
    case 0xce:
      uVar21 = *(uint *)(pcVar13 + -1);
      pacVar16 = (char (*) [16])
                 (ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                        uVar21 << 0x18);
      pcVar31 = acStack_d27 + lVar10 + -4;
      break;
    case 0xcf:
      uVar26 = *(ulong *)(pcVar13 + -1);
      pacVar16 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar31 = acStack_d27 + lVar8 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131a67:
        pcStack_e68 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_e68 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_e68 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar31 = acStack_d27 + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar16 != pacStack_e60) {
      pcStack_e68 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_e68 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1098,"typed read of ",0xf);
      pcStack_10c0 = (code *)0x131b1e;
      pacStack_10a0 = pacVar15;
      lStack_e90 = lVar8;
      uStack_e88 = uVar27;
      pcStack_e80 = pcVar18;
      pcStack_e78 = pcVar31;
      pcStack_e70 = pcVar13;
      pcStack_e68 = (code *)pcVar30;
      iVar5 = snprintf(acStack_1098 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar18 = acStack_1098 + (long)iVar5 + 0xe;
      pcStack_10c0 = (code *)0x131b3f;
      iVar5 = snprintf(pcVar18,(size_t)(&bStack_f98 + -(long)pcVar18)," into ");
      pbVar25 = &bStack_f98 + -(long)(pcVar18 + iVar5);
      pcStack_10c0 = (code *)0x131b59;
      snprintf(pcVar18 + iVar5,(size_t)pbVar25,"double");
      pcStack_10c0 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar10 = 1;
      pcStack_10c0 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_10c0 = (code *)0x131b94;
      fputs(acStack_1098,_stdout);
      pcVar14 = (code *)0xa;
      pcStack_10c0 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar34 = (undefined8 *)(auStack_f97 + 1);
      bStack_f98 = 0xca;
      _auStack_f97 = 0x1059c84a;
      uStack_f8f._7_1_ = 0xcb;
      uStack_f87 = 0x220b5941;
      lVar8 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131a95:
      pcStack_e68 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar21 = *(uint *)(pcVar13 + -1);
    fVar12 = (float)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                    uVar21 << 0x18);
    if ((fVar12 != fStack_e50) || (NAN(fVar12) || NAN(fStack_e50))) goto LAB_00131a6c;
    pcVar31 = pcVar13 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar16 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar16 = (char (*) [16])(long)pcVar13[-1];
      break;
    case 0xd1:
      pacVar16 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar13 + -1) << 8 | *(ushort *)(pcVar13 + -1) >> 8);
      pcVar31 = acStack_d27 + lVar10 + -6;
      break;
    case 0xd2:
      uVar21 = *(uint *)(pcVar13 + -1);
      pacVar16 = (char (*) [16])
                 (long)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                            uVar21 << 0x18);
      pcVar31 = acStack_d27 + lVar10 + -4;
      break;
    case 0xd3:
      uVar26 = *(ulong *)(pcVar13 + -1);
      pacVar16 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar31 = acStack_d27 + lVar8 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_e68 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar31 = acStack_d27 + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar16 != pacStack_e60) goto LAB_00131ab9;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131a71;
    uVar26 = *(ulong *)(pcVar13 + -1);
    dVar17 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                      (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                      (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                      (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if ((dVar17 != dStack_e48) || (NAN(dVar17) || NAN(dStack_e48))) {
      pcStack_e68 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar31 = acStack_d27 + lVar8 * 0x10;
  }
  pcVar30 = pcVar13 + -2;
  pcVar18 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_e40 = 0.0;
  pcStack_e68 = (code *)0x131948;
  pcStack_e58 = pcVar30;
  iVar5 = (*(code *)pacStack_e38)(&pcStack_e58,&dStack_e40);
  if ((char)uStack_e4c == '\0') {
    pcStack_e68 = (code *)0x131a18;
    _ok((uint)(iVar5 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar18);
    bVar38 = pcVar30 == pcStack_e58;
    pcVar31 = "mp_num_pos2 == mp_nums[i]";
    iVar5 = 0x738;
    pcVar20 = "check position";
  }
  else {
    pcVar30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_e68 = (code *)0x131982;
    _ok((uint)(iVar5 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar18);
    pcStack_e68 = (code *)0x1319aa;
    _ok((uint)(pcVar31 == pcStack_e58),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar38 = ABS(dStack_e48 - dStack_e40) < 1e-15;
    pcVar31 = "double_eq(num1, num2)";
    iVar5 = 0x73e;
    pcVar20 = "check float number";
  }
  pacVar15 = (char (*) [16])(ulong)bVar38;
  pcStack_e68 = (code *)0x131a40;
  _ok((uint)bVar38,pcVar31,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar5,
      pcVar20);
  lVar8 = lVar8 + 1;
  pcVar13 = pcVar13 + 0x10;
  uVar27 = uVar27 - 1;
  if (uVar27 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar11 = lVar8 * 0x10;
  bVar2 = *(byte *)((long)puVar34 + -2);
  uVar27 = (ulong)bVar2;
  mVar3 = mp_type_hint[uVar27];
  puVar24 = puVar34;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      uVar27 = (ulong)*(byte *)((long)puVar34 + -1);
      break;
    case 0xcd:
      uVar27 = (ulong)(ushort)(*(ushort *)((long)puVar34 + -1) << 8 |
                              *(ushort *)((long)puVar34 + -1) >> 8);
      puVar24 = (undefined8 *)(auStack_f95 + lVar11);
      break;
    case 0xce:
      uVar21 = *(uint *)((long)puVar34 + -1);
      uVar27 = (ulong)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                      uVar21 << 0x18);
      puVar24 = (undefined8 *)(auStack_f95 + lVar11 + 2);
      break;
    case 0xcf:
      uVar27 = *(ulong *)((long)puVar34 + -1);
      uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
               (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
               (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28
               | uVar27 << 0x38;
      puVar24 = &uStack_f8f + lVar8 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131e46:
        pcStack_10c0 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_10c0 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_10c0 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar24 = (undefined8 *)(auStack_f97 + lVar11);
    }
    if (uVar27 != 0x642c88) {
      pcStack_10c0 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_10c0 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_12d0,"typed read of ",0xf);
      puStack_10d0 = puVar24;
      pbStack_10c8 = pbVar25;
      pcStack_10c0 = (code *)lVar10;
      iVar5 = snprintf(acStack_12d0 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar18 = acStack_12d0 + (long)iVar5 + 0xe;
      iVar5 = snprintf(pcVar18,(size_t)(&uStack_11d0 + -(long)pcVar18)," into ");
      snprintf(pcVar18 + iVar5,(size_t)(&uStack_11d0 + -(long)(pcVar18 + iVar5)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_12d0,_stdout);
      fputc(10,_stdout);
      uStack_11d0 = 0xcb;
      uStack_11cf = 0xb81e85eb513816c0;
      puStack_12d8 = &uStack_11d0;
      dStack_12e0 = 0.0;
      iVar5 = (*pcVar14)(&puStack_12d8,&dStack_12e0);
      _ok((uint)(iVar5 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_11c7 == puStack_12d8),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_12e0) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131e74:
      pcStack_10c0 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar21 = *(uint *)((long)puVar34 + -1);
    fVar12 = (float)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                    uVar21 << 0x18);
    if ((fVar12 != 6.565e+06) || (NAN(fVar12))) goto LAB_00131e4b;
    puVar24 = (undefined8 *)((long)puVar34 + 3);
  }
  else if (mVar3 == MP_INT) {
    uVar27 = (ulong)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      uVar27 = (ulong)*(char *)((long)puVar34 + -1);
      break;
    case 0xd1:
      uVar27 = (ulong)(short)(*(ushort *)((long)puVar34 + -1) << 8 |
                             *(ushort *)((long)puVar34 + -1) >> 8);
      puVar24 = (undefined8 *)(auStack_f95 + lVar11);
      break;
    case 0xd2:
      uVar21 = *(uint *)((long)puVar34 + -1);
      uVar27 = (ulong)(int)(uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                           uVar21 << 0x18);
      puVar24 = (undefined8 *)(auStack_f95 + lVar11 + 2);
      break;
    case 0xd3:
      uVar27 = *(ulong *)((long)puVar34 + -1);
      uVar27 = uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
               (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
               (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28
               | uVar27 << 0x38;
      puVar24 = &uStack_f8f + lVar8 * 2;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_10c0 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar24 = (undefined8 *)(auStack_f97 + lVar11);
    }
    if (uVar27 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131e50;
    uVar27 = *(ulong *)((long)puVar34 + -1);
    dVar17 = (double)(uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
                      (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
                      (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 |
                      (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
    if ((dVar17 != 6565000.0) || (NAN(dVar17))) {
      pcStack_10c0 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar24 = &uStack_f8f + lVar8 * 2;
  }
  puStack_10a8 = (undefined8 *)((long)puVar34 + -2);
  pbVar25 = (byte *)(ulong)(uint)(int)(char)bVar2;
  dStack_10b0 = 0.0;
  pcStack_10c0 = (code *)0x131d8a;
  iVar5 = (*(code *)pacStack_10a0)(&puStack_10a8,&dStack_10b0);
  pcStack_10c0 = (code *)0x131db2;
  _ok((uint)(iVar5 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",pbVar25);
  pcStack_10c0 = (code *)0x131dda;
  _ok((uint)(puVar24 == puStack_10a8),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar38 = ABS(6565000.0 - dStack_10b0) < 1e-15;
  pcVar14 = (code *)(ulong)bVar38;
  pcStack_10c0 = (code *)0x131e1f;
  _ok((uint)bVar38,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar8 = lVar8 + 1;
  puVar34 = puVar34 + 2;
  lVar10 = lVar10 + -1;
  if (lVar10 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}